

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_Client_processPublishResponse
               (UA_Client *client,UA_PublishRequest *request,UA_PublishResponse *response)

{
  ulong *puVar1;
  UA_Client_NotificationsAckNumber *pUVar2;
  uint *puVar3;
  UA_Client_NotificationsAckNumber *pUVar4;
  bool bVar5;
  UA_Client_NotificationsAckNumber *tmpAck;
  UA_Client_MonitoredItem *mon;
  UA_MonitoredItemNotification *mitemNot;
  size_t j;
  UA_DataChangeNotification *dataChangeNotification;
  size_t k;
  UA_NotificationMessage *msg;
  UA_Client_NotificationsAckNumber *ack;
  UA_SubscriptionAcknowledgement *orig_ack;
  size_t i;
  UA_Client_Subscription *sub;
  UA_PublishResponse *response_local;
  UA_PublishRequest *request_local;
  UA_Client *client_local;
  
  if ((response->responseHeader).serviceResult == 0) {
    for (i = (size_t)(client->subscriptions).lh_first;
        (i != 0 && (*(UA_UInt32 *)(i + 0x20) != response->subscriptionId)); i = *(size_t *)i) {
    }
    if (i != 0) {
      UA_LOG_DEBUG((client->config).logger,UA_LOGCATEGORY_CLIENT,
                   "Processing a publish response on subscription %u with %u notifications",
                   (ulong)*(uint *)(i + 0x20),(response->notificationMessage).notificationDataSize);
      orig_ack = (UA_SubscriptionAcknowledgement *)0x0;
      while( true ) {
        bVar5 = false;
        if (orig_ack < (UA_SubscriptionAcknowledgement *)response->resultsSize) {
          bVar5 = orig_ack <
                  (UA_SubscriptionAcknowledgement *)request->subscriptionAcknowledgementsSize;
        }
        if (!bVar5) break;
        if ((response->results[(long)orig_ack] == 0) ||
           (response->results[(long)orig_ack] == 0x807a0000)) {
          for (msg = (UA_NotificationMessage *)(client->pendingNotificationsAcks).lh_first;
              msg != (UA_NotificationMessage *)0x0; msg = *(UA_NotificationMessage **)msg) {
            if (((UA_UInt32)msg->notificationDataSize ==
                 request->subscriptionAcknowledgements[(long)orig_ack].subscriptionId) &&
               (*(UA_UInt32 *)((long)&msg->notificationDataSize + 4) ==
                request->subscriptionAcknowledgements[(long)orig_ack].sequenceNumber)) {
              if (*(long *)msg != 0) {
                *(UA_DateTime *)(*(long *)msg + 8) = msg->publishTime;
              }
              *(undefined8 *)msg->publishTime = *(undefined8 *)msg;
              free(msg);
              if (msg == (UA_NotificationMessage *)(client->pendingNotificationsAcks).lh_first) {
                __assert_fail("ack != ((&client->pendingNotificationsAcks)->lh_first)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                              ,0x671e,
                              "void UA_Client_processPublishResponse(UA_Client *, UA_PublishRequest *, UA_PublishResponse *)"
                             );
              }
              break;
            }
          }
        }
        orig_ack = (UA_SubscriptionAcknowledgement *)((long)&orig_ack->subscriptionId + 1);
      }
      for (dataChangeNotification = (UA_DataChangeNotification *)0x0;
          dataChangeNotification <
          (UA_DataChangeNotification *)(response->notificationMessage).notificationDataSize;
          dataChangeNotification =
               (UA_DataChangeNotification *)((long)&dataChangeNotification->monitoredItemsSize + 1))
      {
        if (((response->notificationMessage).notificationData[(long)dataChangeNotification].encoding
             == UA_EXTENSIONOBJECT_DECODED) &&
           ((response->notificationMessage).notificationData[(long)dataChangeNotification].content.
            decoded.type == (UA_DataType *)0x1618b0)) {
          puVar1 = (ulong *)(response->notificationMessage).notificationData
                            [(long)dataChangeNotification].content.decoded.data;
          for (mitemNot = (UA_MonitoredItemNotification *)0x0;
              mitemNot < (UA_MonitoredItemNotification *)*puVar1;
              mitemNot = (UA_MonitoredItemNotification *)((long)&mitemNot->clientHandle + 1)) {
            puVar3 = (uint *)(puVar1[1] + (long)mitemNot * 0x68);
            for (tmpAck = *(UA_Client_NotificationsAckNumber **)(i + 0x30);
                tmpAck != (UA_Client_NotificationsAckNumber *)0x0;
                tmpAck = (tmpAck->listEntry).le_next) {
              if (*(uint *)((long)&tmpAck[2].listEntry.le_next + 4) == *puVar3) {
                (*(code *)tmpAck[3].listEntry.le_next)
                          ((tmpAck->subAck).subscriptionId,puVar3 + 2,tmpAck[3].listEntry.le_prev);
                break;
              }
            }
            if (tmpAck == (UA_Client_NotificationsAckNumber *)0x0) {
              UA_LOG_DEBUG((client->config).logger,UA_LOGCATEGORY_CLIENT,
                           "Could not process a notification with clienthandle %u on subscription %u"
                           ,(ulong)*puVar3,(ulong)*(uint *)(i + 0x20));
            }
          }
        }
      }
      pUVar4 = (UA_Client_NotificationsAckNumber *)malloc(0x18);
      if (pUVar4 == (UA_Client_NotificationsAckNumber *)0x0) {
        UA_LOG_WARNING((client->config).logger,UA_LOGCATEGORY_CLIENT,
                       "Not enough memory to store the acknowledgement for a publish message on subscription %u"
                       ,(ulong)*(uint *)(i + 0x20));
      }
      else {
        (pUVar4->subAck).sequenceNumber = (response->notificationMessage).sequenceNumber;
        (pUVar4->subAck).subscriptionId = *(UA_UInt32 *)(i + 0x20);
        pUVar2 = (client->pendingNotificationsAcks).lh_first;
        (pUVar4->listEntry).le_next = pUVar2;
        if (pUVar2 != (UA_Client_NotificationsAckNumber *)0x0) {
          (((client->pendingNotificationsAcks).lh_first)->listEntry).le_prev =
               (UA_Client_NotificationsAckNumber **)pUVar4;
        }
        (client->pendingNotificationsAcks).lh_first = pUVar4;
        (pUVar4->listEntry).le_prev = &(client->pendingNotificationsAcks).lh_first;
      }
    }
  }
  return;
}

Assistant:

static void
UA_Client_processPublishResponse(UA_Client *client, UA_PublishRequest *request,
                                 UA_PublishResponse *response) {
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD)
        return;

    /* Find the subscription */
    UA_Client_Subscription *sub;
    LIST_FOREACH(sub, &client->subscriptions, listEntry) {
        if(sub->subscriptionID == response->subscriptionId)
            break;
    }
    if(!sub)
        return;

    UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_CLIENT,
                 "Processing a publish response on subscription %u with %u notifications",
                 sub->subscriptionID, response->notificationMessage.notificationDataSize);

    /* Check if the server has acknowledged any of the sent ACKs */
    for(size_t i = 0; i < response->resultsSize && i < request->subscriptionAcknowledgementsSize; ++i) {
        /* remove also acks that are unknown to the server */
        if(response->results[i] != UA_STATUSCODE_GOOD &&
           response->results[i] != UA_STATUSCODE_BADSEQUENCENUMBERUNKNOWN)
            continue;

        /* Remove the ack from the list */
        UA_SubscriptionAcknowledgement *orig_ack = &request->subscriptionAcknowledgements[i];
        UA_Client_NotificationsAckNumber *ack;
        LIST_FOREACH(ack, &client->pendingNotificationsAcks, listEntry) {
            if(ack->subAck.subscriptionId == orig_ack->subscriptionId &&
               ack->subAck.sequenceNumber == orig_ack->sequenceNumber) {
                LIST_REMOVE(ack, listEntry);
                UA_free(ack);
                UA_assert(ack != LIST_FIRST(&client->pendingNotificationsAcks));
                break;
            }
        }
    }

    /* Process the notification messages */
    UA_NotificationMessage *msg = &response->notificationMessage;
    for(size_t k = 0; k < msg->notificationDataSize; ++k) {
        if(msg->notificationData[k].encoding != UA_EXTENSIONOBJECT_DECODED)
            continue;

        /* Currently only dataChangeNotifications are supported */
        if(msg->notificationData[k].content.decoded.type != &UA_TYPES[UA_TYPES_DATACHANGENOTIFICATION])
            continue;

        UA_DataChangeNotification *dataChangeNotification = msg->notificationData[k].content.decoded.data;
        for(size_t j = 0; j < dataChangeNotification->monitoredItemsSize; ++j) {
            UA_MonitoredItemNotification *mitemNot = &dataChangeNotification->monitoredItems[j];
            UA_Client_MonitoredItem *mon;
            LIST_FOREACH(mon, &sub->monitoredItems, listEntry) {
                if(mon->clientHandle == mitemNot->clientHandle) {
                    mon->handler(mon->monitoredItemId, &mitemNot->value, mon->handlerContext);
                    break;
                }
            }
            if(!mon)
                UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_CLIENT,
                             "Could not process a notification with clienthandle %u on subscription %u",
                             mitemNot->clientHandle, sub->subscriptionID);
        }
    }

    /* Add to the list of pending acks */
    UA_Client_NotificationsAckNumber *tmpAck = UA_malloc(sizeof(UA_Client_NotificationsAckNumber));
    if(!tmpAck) {
        UA_LOG_WARNING(client->config.logger, UA_LOGCATEGORY_CLIENT,
                       "Not enough memory to store the acknowledgement for a "
                       "publish message on subscription %u", sub->subscriptionID);
        return;
    }
    tmpAck->subAck.sequenceNumber = msg->sequenceNumber;
    tmpAck->subAck.subscriptionId = sub->subscriptionID;
    LIST_INSERT_HEAD(&client->pendingNotificationsAcks, tmpAck, listEntry);
}